

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>>
::
Chain_matrix<std::function<bool(unsigned_int,unsigned_int)>,std::function<bool(unsigned_int,unsigned_int)>,std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false>>>
           *this,vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *orderedBoundaries,Column_settings *colSettings,
          function<bool_(unsigned_int,_unsigned_int)> *birthComparator,
          function<bool_(unsigned_int,_unsigned_int)> *deathComparator)

{
  Column_settings *this_00;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference boundary;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b8;
  reference local_a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *b;
  const_iterator __end0;
  const_iterator __begin0;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__range3;
  function<bool_(unsigned_int,_unsigned_int)> local_70;
  function<bool_(unsigned_int,_unsigned_int)> local_50;
  function<bool_(unsigned_int,_unsigned_int)> *local_30;
  function<bool_(unsigned_int,_unsigned_int)> *deathComparator_local;
  function<bool_(unsigned_int,_unsigned_int)> *birthComparator_local;
  Column_settings *colSettings_local;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *orderedBoundaries_local;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>_>
  *this_local;
  
  local_30 = deathComparator;
  deathComparator_local = birthComparator;
  birthComparator_local = (function<bool_(unsigned_int,_unsigned_int)> *)colSettings;
  colSettings_local = (Column_settings *)orderedBoundaries;
  orderedBoundaries_local =
       (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        *)this;
  iVar2 = Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>
          ::get_null_value<int>();
  Dummy_matrix_dimension_holder::Dummy_matrix_dimension_holder<int>
            ((Dummy_matrix_dimension_holder *)this,iVar2);
  std::function<bool_(unsigned_int,_unsigned_int)>::function(&local_50,deathComparator_local);
  std::function<bool_(unsigned_int,_unsigned_int)>::function(&local_70,local_30);
  Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>_>
  ::Chain_vine_swap((Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>_>
                     *)this,&local_50,&local_70);
  std::function<bool_(unsigned_int,_unsigned_int)>::~function(&local_70);
  std::function<bool_(unsigned_int,_unsigned_int)>::~function(&local_50);
  Chain_representative_cycles<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>_>
  ::Chain_representative_cycles
            ((Chain_representative_cycles<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>_>
              *)(this + 0x40));
  sVar3 = std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::size((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)colSettings_local);
  Dummy_matrix_row_access::Dummy_matrix_row_access((Dummy_matrix_row_access *)this,(uint)sVar3);
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>_>_>_>
  ::vector((vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>_>_>_>
            *)(this + 0x70));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(this + 0x88));
  *(undefined4 *)(this + 0xa0) = 0;
  *(function<bool_(unsigned_int,_unsigned_int)> **)(this + 0xa8) = birthComparator_local;
  sVar3 = std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::size((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)colSettings_local);
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>_>_>_>
  ::reserve((vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>_>_>_>
             *)(this + 0x70),sVar3);
  sVar3 = std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::size((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)colSettings_local);
  __range3._0_4_ =
       Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>
       ::get_null_value<unsigned_int>();
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(this + 0x88),sVar3,
             (value_type_conflict *)&__range3);
  this_00 = colSettings_local;
  __end0 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::begin((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)colSettings_local);
  b = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::end((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                *)&b);
    if (!bVar1) break;
    boundary = __gnu_cxx::
               __normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
               ::operator*(&__end0);
    local_a0 = boundary;
    iVar2 = Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false>_>
            ::get_null_value<int>();
    insert_boundary<std::vector<unsigned_int,std::allocator<unsigned_int>>>
              (&local_b8,this,boundary,iVar2);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_b8);
    __gnu_cxx::
    __normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

inline Chain_matrix<Master_matrix>::Chain_matrix(const std::vector<Boundary_range>& orderedBoundaries,
                                                 Column_settings* colSettings,
                                                 const BirthComparatorFunction& birthComparator,
                                                 const DeathComparatorFunction& deathComparator)
    : Dim_opt(Master_matrix::template get_null_value<Dimension>()),
      Pair_opt(),
      Swap_opt(birthComparator, deathComparator),
      Rep_opt(),
      RA_opt(orderedBoundaries.size()),
      nextIndex_(0),
      colSettings_(colSettings)
{
  matrix_.reserve(orderedBoundaries.size());
  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    pivotToColumnIndex_.reserve(orderedBoundaries.size());
  } else {
    pivotToColumnIndex_.resize(orderedBoundaries.size(), Master_matrix::template get_null_value<Index>());
  }
  for (const Boundary_range& b : orderedBoundaries) {
    insert_boundary(b);
  }
}